

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBox.cpp
# Opt level: O1

CPoint * __thiscall CBBox::GetCenter(CPoint *__return_storage_ptr__,CBBox *this)

{
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  
  sVar3 = this->m_iMinX;
  sVar4 = this->m_iMaxX;
  sVar5 = this->m_iMinY;
  sVar6 = this->m_iMaxY;
  cVar1 = this->m_cMinZ;
  cVar2 = this->m_cMaxZ;
  CPoint::CPoint(__return_storage_ptr__);
  CPoint::Initialize(__return_storage_ptr__,((int)sVar4 + (int)sVar3) / 2,
                     ((int)sVar6 + (int)sVar5) / 2,((int)cVar2 + (int)cVar1) / 2,(CWire *)0x0);
  return __return_storage_ptr__;
}

Assistant:

CPoint CBBox::GetCenter()
{
	int	iX	=	(m_iMinX+m_iMaxX)/2;
	int	iY	=	(m_iMinY+m_iMaxY)/2;
	int	iZ	=	(m_cMinZ+m_cMaxZ)/2;

	CPoint	Ret;
	Ret.Initialize(iX,iY,iZ,NULL);

	return	Ret;
}